

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

int Cec2_ObjSimEqual(Gia_Man_t *p,int iObj0,int iObj1)

{
  word *pwVar1;
  word *pwVar2;
  word *pSim1;
  word *pSim0;
  int w;
  int iObj1_local;
  int iObj0_local;
  Gia_Man_t *p_local;
  
  pwVar1 = Cec2_ObjSim(p,iObj0);
  pwVar2 = Cec2_ObjSim(p,iObj1);
  if ((*pwVar1 & 1) == (*pwVar2 & 1)) {
    for (pSim0._4_4_ = 0; pSim0._4_4_ < p->nSimWords; pSim0._4_4_ = pSim0._4_4_ + 1) {
      if (pwVar1[pSim0._4_4_] != pwVar2[pSim0._4_4_]) {
        return 0;
      }
    }
  }
  else {
    for (pSim0._4_4_ = 0; pSim0._4_4_ < p->nSimWords; pSim0._4_4_ = pSim0._4_4_ + 1) {
      if (pwVar1[pSim0._4_4_] != (pwVar2[pSim0._4_4_] ^ 0xffffffffffffffff)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static inline int Cec2_ObjSimEqual( Gia_Man_t * p, int iObj0, int iObj1 )
{
    int w;
    word * pSim0 = Cec2_ObjSim( p, iObj0 );
    word * pSim1 = Cec2_ObjSim( p, iObj1 );
    if ( (pSim0[0] & 1) == (pSim1[0] & 1) )
    {
        for ( w = 0; w < p->nSimWords; w++ )
            if ( pSim0[w] != pSim1[w] )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < p->nSimWords; w++ )
            if ( pSim0[w] != ~pSim1[w] )
                return 0;
        return 1;
    }
}